

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::FindFilesToPruneManual
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int nManualPruneHeight,Chainstate *chain,ChainstateManager *chainman)

{
  pointer pCVar1;
  string_view source_file;
  byte bVar2;
  bool bVar3;
  Logger *pLVar4;
  BlockfileCursor BVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  int fileNumber;
  BlockfileCursor BVar9;
  uint uVar10;
  int *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string log_msg;
  ChainstateRole local_108;
  int local_104;
  pair<int,_int> local_100;
  unique_lock<std::recursive_mutex> local_f0;
  unique_lock<std::recursive_mutex> local_e0 [7];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((nManualPruneHeight < 1) || (this->m_prune_mode == false)) {
    __assert_fail("IsPruneMode() && nManualPruneHeight > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x116,
                  "void node::BlockManager::FindFilesToPruneManual(std::set<int> &, int, const Chainstate &, ChainstateManager &)"
                 );
  }
  local_e0[0]._M_device = &cs_main.super_recursive_mutex;
  local_e0[0]._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(local_e0);
  local_f0._M_owns = false;
  local_f0._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_f0);
  if (0 < (int)((ulong)((long)(chain->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chain->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    local_100 = ChainstateManager::GetPruneRange(chainman,chain,nManualPruneHeight);
    uVar7 = 0;
    local_104 = 0;
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffff00000000;
    bVar2 = (this->m_blockfile_cursors)._M_elems[0].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
    BVar5 = (this->m_blockfile_cursors)._M_elems[0].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
    uVar8 = BVar5.file_num;
    if ((bool)bVar2 == false) {
      uVar8 = uVar7;
    }
    bVar6 = (this->m_blockfile_cursors)._M_elems[1].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
    BVar9 = (this->m_blockfile_cursors)._M_elems[1].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
    uVar10 = BVar9.file_num;
    if ((bool)bVar6 == false) {
      uVar10 = uVar7;
    }
    if ((int)uVar10 < (int)uVar8) {
      uVar10 = uVar8;
    }
    if (0 < (int)uVar10) {
      fileNumber = 0;
      do {
        pCVar1 = (this->m_blockfile_info).
                 super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((pCVar1[fileNumber].nSize != 0) &&
            (pCVar1[fileNumber].nHeightLast <= (uint)local_100.second)) &&
           ((uint)local_100.first <= pCVar1[fileNumber].nHeightFirst)) {
          PruneOneBlockFile(this,fileNumber);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     setFilesToPrune,(int *)&local_50);
          local_104 = local_104 + 1;
          bVar2 = (this->m_blockfile_cursors)._M_elems[0].
                  super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                  super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
          BVar5 = (this->m_blockfile_cursors)._M_elems[0].
                  super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                  super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
          bVar6 = (this->m_blockfile_cursors)._M_elems[1].
                  super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                  super__Optional_payload_base<node::BlockfileCursor>._M_engaged;
          BVar9 = (this->m_blockfile_cursors)._M_elems[1].
                  super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                  super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value;
          fileNumber = (int)local_50._M_dataplus._M_p;
        }
        fileNumber = fileNumber + 1;
        local_50._M_dataplus._M_p._0_4_ = fileNumber;
        uVar8 = 0;
        if ((bVar2 & 1) != 0) {
          uVar8 = BVar5.file_num;
        }
        uVar10 = BVar9.file_num;
        if ((bVar6 & 1) == 0) {
          uVar10 = uVar7;
        }
        if ((int)uVar10 < (int)uVar8) {
          uVar10 = uVar8;
        }
        in_R9 = (int *)(ulong)uVar10;
      } while (fileNumber < (int)uVar10);
    }
    local_108 = Chainstate::GetRole(chain);
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar4);
    if (bVar3) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tinyformat::format<ChainstateRole,int,int>
                (&local_70,
                 (tinyformat *)"[%s] Prune (Manual): prune_height=%d removed %d blk/rev pairs\n",
                 (char *)&local_108,(ChainstateRole *)&local_100.second,&local_104,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x5e;
      local_70._M_string_length = 0x801f09;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      str._M_str = local_50._M_dataplus._M_p;
      str._M_len = local_50._M_string_length;
      logging_function._M_str = "FindFilesToPruneManual";
      logging_function._M_len = 0x16;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,299,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f0);
  std::unique_lock<std::recursive_mutex>::~unique_lock(local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::FindFilesToPruneManual(
    std::set<int>& setFilesToPrune,
    int nManualPruneHeight,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    assert(IsPruneMode() && nManualPruneHeight > 0);

    LOCK2(cs_main, cs_LastBlockFile);
    if (chain.m_chain.Height() < 0) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, nManualPruneHeight);

    int count = 0;
    for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
        const auto& fileinfo = m_blockfile_info[fileNumber];
        if (fileinfo.nSize == 0 || fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
            continue;
        }

        PruneOneBlockFile(fileNumber);
        setFilesToPrune.insert(fileNumber);
        count++;
    }
    LogPrintf("[%s] Prune (Manual): prune_height=%d removed %d blk/rev pairs\n",
        chain.GetRole(), last_block_can_prune, count);
}